

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O0

int Abc_NtkRefactor(Abc_Ntk_t *pNtk,int nNodeSizeMax,int nConeSizeMax,int fUpdateLevel,int fUseZeros
                   ,int fUseDcs,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Abc_ManCut_t *p;
  Abc_ManRef_t *p_00;
  Vec_Ptr_t *pVVar4;
  ProgressBar *p_01;
  Abc_Obj_t *pObj;
  abctime aVar5;
  Dec_Graph_t *pGraph;
  abctime aVar6;
  int local_74;
  int nNodes;
  int i;
  abctime clkStart;
  abctime clk;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vFanins;
  Dec_Graph_t *pFForm;
  Abc_ManCut_t *pManCut;
  Abc_ManRef_t *pManRef;
  ProgressBar *pProgress;
  int fUseDcs_local;
  int fUseZeros_local;
  int fUpdateLevel_local;
  int nConeSizeMax_local;
  int nNodeSizeMax_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRefactor.c"
                  ,0x152,"int Abc_NtkRefactor(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000);
  p_00 = Abc_NtkManRefStart(nNodeSizeMax,nConeSizeMax,fUseDcs,fVerbose);
  pVVar4 = Abc_NtkManCutReadCutLarge(p);
  p_00->vLeaves = pVVar4;
  if (fUpdateLevel != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesBeg = iVar1;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_01 = Extra_ProgressBarStart(_stdout,iVar1);
  for (local_74 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_74 < iVar2; local_74 = local_74 + 1) {
    pObj = Abc_NtkObj(pNtk,local_74);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj), iVar2 != 0)) {
      Extra_ProgressBarUpdate(p_01,local_74,(char *)0x0);
      iVar2 = Abc_NodeIsPersistant(pObj);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum(pObj), iVar2 < 0x3e9)) {
        if (iVar1 <= local_74) break;
        aVar6 = Abc_Clock();
        pVVar4 = Abc_NodeFindCut(p,pObj,fUseDcs);
        aVar5 = Abc_Clock();
        p_00->timeCut = (aVar5 - aVar6) + p_00->timeCut;
        aVar6 = Abc_Clock();
        pGraph = Abc_NodeRefactor(p_00,pObj,pVVar4,fUpdateLevel,fUseZeros,fUseDcs,fVerbose);
        aVar5 = Abc_Clock();
        p_00->timeRes = (aVar5 - aVar6) + p_00->timeRes;
        if (pGraph != (Dec_Graph_t *)0x0) {
          aVar6 = Abc_Clock();
          Dec_GraphUpdateNetwork(pObj,pGraph,fUpdateLevel,p_00->nLastGain);
          aVar5 = Abc_Clock();
          p_00->timeNtk = (aVar5 - aVar6) + p_00->timeNtk;
          Dec_GraphFree(pGraph);
        }
      }
    }
  }
  Extra_ProgressBarStop(p_01);
  aVar6 = Abc_Clock();
  p_00->timeTotal = aVar6 - aVar3;
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesEnd = iVar1;
  if (fVerbose != 0) {
    Abc_NtkManRefPrintStats(p_00);
  }
  Abc_NtkManCutStop(p);
  Abc_NtkManRefStop(p_00);
  Abc_NtkReassignIds(pNtk);
  if (fUpdateLevel == 0) {
    Abc_NtkLevel(pNtk);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk);
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    printf("Abc_NtkRefactor: The network check has failed.\n");
  }
  pNtk_local._4_4_ = (uint)(iVar1 != 0);
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkRefactor( Abc_Ntk_t * pNtk, int nNodeSizeMax, int nConeSizeMax, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRef_t * pManRef;
    Abc_ManCut_t * pManCut;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, 1000 );
    pManRef = Abc_NtkManRefStart( nNodeSizeMax, nConeSizeMax, fUseDcs, fVerbose );
    pManRef->vLeaves   = Abc_NtkManCutReadCutLarge( pManCut );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    // resynthesize each node once
    pManRef->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vFanins = Abc_NodeFindCut( pManCut, pNode, fUseDcs );
pManRef->timeCut += Abc_Clock() - clk;
        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_NodeRefactor( pManRef, pNode, vFanins, fUpdateLevel, fUseZeros, fUseDcs, fVerbose );
pManRef->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRef->nLastGain );
pManRef->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRef->timeTotal = Abc_Clock() - clkStart;
    pManRef->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics of the manager
    if ( fVerbose )
        Abc_NtkManRefPrintStats( pManRef );
    // delete the managers
    Abc_NtkManCutStop( pManCut );
    Abc_NtkManRefStop( pManRef );
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;
}